

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O0

void __thiscall TApp_BuiltinComplexFail_Test::TestBody(TApp_BuiltinComplexFail_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  AssertHelper local_130;
  Message local_128 [2];
  ArgumentMismatch *anon_var_0;
  char *pcStack_110;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  iterator local_b8;
  size_type local_b0;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  cx comp;
  TApp_BuiltinComplexFail_Test *this_local;
  
  comp._M_value._8_8_ = this;
  CLI::std::complex<double>::complex((complex<double> *)local_20,1.0,2.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"-c,--complex",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"COMPLEX",&local_a1);
  CLI::App::add_complex<std::complex<double>>
            (&(this->super_TApp).app,&local_40,(complex<double> *)local_20,&local_78,false,&local_a0
            );
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  gtest_msg.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"-c",(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"4",(allocator *)((long)&gtest_msg.value + 6));
  gtest_msg.value._5_1_ = 0;
  local_b8 = &local_f8;
  local_b0 = 2;
  __l._M_len = 2;
  __l._M_array = local_b8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
  do {
    local_180 = local_180 + -1;
    std::__cxx11::string::~string((string *)local_180);
  } while (local_180 != &local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffef0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffef0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_110 = 
    "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_128);
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
             ,0x62,pcStack_110);
  testing::internal::AssertHelper::operator=(&local_130,local_128);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  testing::Message::~Message(local_128);
  return;
}

Assistant:

TEST_F(TApp, BuiltinComplexFail) {
    cx comp{1, 2};
    app.add_complex("-c,--complex", comp);

    args = {"-c", "4"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}